

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void allocate_imp<ImputedData<int,long_double>,InputData<float,int>>
               (InputData<float,_int> *input_data,
               vector<ImputedData<int,_long_double>,_std::allocator<ImputedData<int,_long_double>_>_>
               *impute_vec,
               robin_map<unsigned_long,_ImputedData<int,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<int,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *impute_map,int nthreads)

{
  if (input_data->n_missing == 0) {
    return;
  }
  if (input_data->nrows / (ulong)(long)(nthreads * 10) < input_data->n_missing) {
    allocate_imp_vec<ImputedData<int,long_double>,InputData<float,int>>
              (impute_vec,input_data,nthreads);
    return;
  }
  allocate_imp_map<ImputedData<int,long_double>,InputData<float,int>>(impute_map,input_data);
  return;
}

Assistant:

void allocate_imp(InputData &input_data,
                  std::vector<ImputedData> &impute_vec,
                  hashed_map<size_t, ImputedData> &impute_map,
                  int nthreads)
{
    if (input_data.n_missing == 0)
        return;
    else if (input_data.n_missing <= input_data.nrows / (nthreads * 10))
        allocate_imp_map(impute_map, input_data);
    else
        allocate_imp_vec(impute_vec, input_data, nthreads);
}